

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::tessellation::anon_unknown_1::GridRenderTestInstance::iterate
          (TestStatus *__return_storage_ptr__,GridRenderTestInstance *this)

{
  deUint32 *this_00;
  int iVar1;
  VkRenderPass VVar2;
  VkPipelineLayout pipelineLayout_00;
  VkCommandBuffer commandBuffer;
  VkCommandBuffer_s *pVVar3;
  deUint64 dVar4;
  VkImageSubresourceRange subresourceRange;
  VkImageSubresourceRange subresourceRange_00;
  VkImageSubresourceRange subresourceRange_01;
  RefData<vk::Handle<(vk::HandleType)13>_> data;
  RefData<vk::Handle<(vk::HandleType)17>_> data_00;
  RefData<vk::Handle<(vk::HandleType)23>_> data_01;
  RefData<vk::Handle<(vk::HandleType)16>_> data_02;
  RefData<vk::Handle<(vk::HandleType)24>_> data_03;
  RefData<vk::VkCommandBuffer_s_*> data_04;
  RefData<vk::Handle<(vk::HandleType)18>_> data_05;
  VkImageSubresourceLayers subresourceLayers_00;
  deUint32 dVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  deUint32 dVar9;
  deUint32 height;
  InstanceInterface *vki;
  VkPhysicalDevice physDevice;
  TestContext *pTVar10;
  TestLog *pTVar11;
  MessageBuilder *this_01;
  DeviceInterface *vk_00;
  VkDevice device_00;
  VkQueue queue_00;
  Allocator *allocator_00;
  VkDeviceSize bufferSize;
  VkImage *pVVar12;
  Handle<(vk::HandleType)17> *pHVar13;
  Handle<(vk::HandleType)13> *pHVar14;
  Handle<(vk::HandleType)24> *pHVar15;
  GraphicsPipelineBuilder *pGVar16;
  ProgramCollection<vk::ProgramBinary> *pPVar17;
  ProgramBinary *pPVar18;
  Handle<(vk::HandleType)16> *pHVar19;
  VkCommandBuffer_s **ppVVar20;
  Handle<(vk::HandleType)23> *pHVar21;
  Handle<(vk::HandleType)18> *pHVar22;
  VkBuffer *pVVar23;
  Allocation *this_02;
  VkDeviceSize offset;
  void *data_06;
  VkImageSubresourceLayers VVar24;
  VkExtent3D extent;
  bool local_d75;
  allocator<char> local_a61;
  string local_a60;
  byte local_a3b;
  byte local_a3a;
  allocator<char> local_a39;
  string local_a38;
  ConstPixelBufferAccess local_a18;
  int local_9f0;
  bool local_9e9;
  int ndx;
  bool allOk;
  undefined1 local_9e0 [8];
  ConstPixelBufferAccess imageAllLayers;
  Allocation *alloc;
  undefined1 local_9a0 [8];
  VkBufferMemoryBarrier postCopyBarrier;
  undefined1 local_910 [8];
  VkBufferImageCopy copyRegion;
  VkImageSubresourceLayers subresourceLayers;
  undefined1 local_8a8 [8];
  VkImageMemoryBarrier colorAttachmentPreCopyBarrier;
  undefined1 local_848 [8];
  Vec4 clearColor;
  VkRect2D renderArea;
  undefined1 local_808 [8];
  VkImageMemoryBarrier colorAttachmentLayoutBarrier;
  allocator<char> local_7a9;
  string local_7a8;
  allocator<char> local_781;
  string local_780;
  allocator<char> local_759;
  string local_758;
  allocator<char> local_731;
  string local_730;
  allocator<char> local_709;
  string local_708;
  GraphicsPipelineBuilder local_6e8;
  Move<vk::Handle<(vk::HandleType)18>_> local_5e0;
  RefData<vk::Handle<(vk::HandleType)18>_> local_5c0;
  undefined1 local_5a0 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> pipeline;
  Move<vk::VkCommandBuffer_s_*> local_578;
  RefData<vk::VkCommandBuffer_s_*> local_558;
  undefined1 local_538 [8];
  Unique<vk::VkCommandBuffer_s_*> cmdBuffer;
  RefData<vk::Handle<(vk::HandleType)24>_> local_4f8;
  undefined1 local_4d8 [8];
  Unique<vk::Handle<(vk::HandleType)24>_> cmdPool;
  RefData<vk::Handle<(vk::HandleType)16>_> local_498;
  undefined1 local_478 [8];
  Unique<vk::Handle<(vk::HandleType)16>_> pipelineLayout;
  Move<vk::Handle<(vk::HandleType)23>_> local_448;
  RefData<vk::Handle<(vk::HandleType)23>_> local_428;
  undefined1 local_408 [8];
  Unique<vk::Handle<(vk::HandleType)23>_> framebuffer;
  RefData<vk::Handle<(vk::HandleType)17>_> local_3c8;
  undefined1 local_3a8 [8];
  Unique<vk::Handle<(vk::HandleType)17>_> renderPass;
  Move<vk::Handle<(vk::HandleType)13>_> local_368;
  RefData<vk::Handle<(vk::HandleType)13>_> local_348;
  undefined1 local_328 [8];
  Unique<vk::Handle<(vk::HandleType)13>_> colorAttachmentView;
  VkBufferCreateInfo local_300;
  undefined1 local_2c8 [8];
  Buffer colorBuffer;
  VkDeviceSize colorBufferSizeBytes;
  undefined1 local_280 [8];
  Image colorAttachmentImage;
  undefined1 local_248 [4];
  VkImageViewType colorAttachmentViewType;
  VkImageCreateInfo colorImageCreateInfo;
  VkImageSubresourceRange colorImageAllLayersRange;
  VkFormat colorFormat;
  IVec2 renderSize;
  Allocator *allocator;
  deUint32 queueFamilyIndex;
  VkQueue queue;
  VkDevice device;
  DeviceInterface *vk;
  MessageBuilder local_198;
  GridRenderTestInstance *local_18;
  GridRenderTestInstance *this_local;
  
  local_18 = this;
  this_local = (GridRenderTestInstance *)__return_storage_ptr__;
  vki = Context::getInstanceInterface((this->super_TestInstance).m_context);
  physDevice = Context::getPhysicalDevice((this->super_TestInstance).m_context);
  requireFeatures(vki,physDevice,3);
  pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  tcu::TestLog::operator<<(&local_198,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_198,
                       (char (*) [135])
                       "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
                      );
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_198);
  vk_00 = Context::getDeviceInterface((this->super_TestInstance).m_context);
  device_00 = Context::getDevice((this->super_TestInstance).m_context);
  queue_00 = Context::getUniversalQueue((this->super_TestInstance).m_context);
  dVar5 = Context::getUniversalQueueFamilyIndex((this->super_TestInstance).m_context);
  allocator_00 = Context::getDefaultAllocator((this->super_TestInstance).m_context);
  this_00 = &colorImageAllLayersRange.layerCount;
  tcu::Vector<int,_2>::Vector((Vector<int,_2> *)this_00,0x100,0x100);
  colorImageAllLayersRange.baseArrayLayer = 0x25;
  ::vk::makeImageSubresourceRange
            ((VkImageSubresourceRange *)&colorImageCreateInfo.initialLayout,1,0,1,0,
             (this->m_params).numLayers);
  makeImageCreateInfo((VkImageCreateInfo *)local_248,(IVec2 *)this_00,VK_FORMAT_R8G8B8A8_UNORM,0x11,
                      (this->m_params).numLayers);
  colorAttachmentImage.m_allocation.
  super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_ =
       (uint)((this->m_params).numLayers != 1) * 4 + 1;
  tessellation::Image::Image
            ((Image *)local_280,vk_00,device_00,allocator_00,(VkImageCreateInfo *)local_248,
             ::vk::MemoryRequirement::Any);
  iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)this_00);
  iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  iVar1 = (this->m_params).numLayers;
  colorBuffer.m_allocation.super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
  m_data._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar8 = tcu::getPixelSize((TextureFormat)
                            colorBuffer.m_allocation.
                            super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.
                            m_data._8_8_);
  bufferSize = (VkDeviceSize)(iVar6 * iVar7 * iVar1 * iVar8);
  makeBufferCreateInfo(&local_300,bufferSize,2);
  colorAttachmentView.super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator.
  _4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  tessellation::Buffer::Buffer
            ((Buffer *)local_2c8,vk_00,device_00,allocator_00,&local_300,
             ::vk::MemoryRequirement::HostVisible);
  pVVar12 = tessellation::Image::operator*((Image *)local_280);
  renderPass.super_RefBase<vk::Handle<(vk::HandleType)17>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)colorImageCreateInfo._80_8_;
  subresourceRange.levelCount = colorImageAllLayersRange.aspectMask;
  subresourceRange.aspectMask = colorImageCreateInfo.initialLayout;
  subresourceRange.baseMipLevel = colorImageCreateInfo._84_4_;
  subresourceRange.baseArrayLayer = colorImageAllLayersRange.baseMipLevel;
  subresourceRange.layerCount = colorImageAllLayersRange.levelCount;
  makeImageView(&local_368,vk_00,device_00,(VkImage)pVVar12->m_internal,
                colorAttachmentImage.m_allocation.
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data._12_4_,
                VK_FORMAT_R8G8B8A8_UNORM,subresourceRange);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_348,(Move *)&local_368);
  data.deleter.m_deviceIface._0_4_ = (int)local_348.deleter.m_deviceIface;
  data.object.m_internal = local_348.object.m_internal;
  data.deleter.m_deviceIface._4_4_ = (int)((ulong)local_348.deleter.m_deviceIface >> 0x20);
  data.deleter.m_device._0_4_ = (int)local_348.deleter.m_device;
  data.deleter.m_device._4_4_ = (int)((ulong)local_348.deleter.m_device >> 0x20);
  data.deleter.m_allocator._0_4_ = (int)local_348.deleter.m_allocator;
  data.deleter.m_allocator._4_4_ = (int)((ulong)local_348.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_328,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)13>_>::~Move(&local_368);
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)
                 &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                  m_allocator,vk_00,device_00,VK_FORMAT_R8G8B8A8_UNORM);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3c8,
             (Move *)&framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.
                      m_allocator);
  data_00.deleter.m_deviceIface._0_4_ = (int)local_3c8.deleter.m_deviceIface;
  data_00.object.m_internal = local_3c8.object.m_internal;
  data_00.deleter.m_deviceIface._4_4_ = (int)((ulong)local_3c8.deleter.m_deviceIface >> 0x20);
  data_00.deleter.m_device._0_4_ = (int)local_3c8.deleter.m_device;
  data_00.deleter.m_device._4_4_ = (int)((ulong)local_3c8.deleter.m_device >> 0x20);
  data_00.deleter.m_allocator._0_4_ = (int)local_3c8.deleter.m_allocator;
  data_00.deleter.m_allocator._4_4_ = (int)((ulong)local_3c8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a8,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)17>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)17>_> *)
             &framebuffer.super_RefBase<vk::Handle<(vk::HandleType)23>_>.m_data.deleter.m_allocator)
  ;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  VVar2.m_internal = pHVar13->m_internal;
  pHVar14 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)13>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)13>_> *)local_328);
  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar14->m_internal;
  dVar9 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  height = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  makeFramebuffer(&local_448,vk_00,device_00,VVar2,
                  (VkImageView)
                  pipelineLayout.super_RefBase<vk::Handle<(vk::HandleType)16>_>.m_data.deleter.
                  m_allocator,dVar9,height,(this->m_params).numLayers);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_428,(Move *)&local_448);
  data_01.deleter.m_deviceIface._0_4_ = (int)local_428.deleter.m_deviceIface;
  data_01.object.m_internal = local_428.object.m_internal;
  data_01.deleter.m_deviceIface._4_4_ = (int)((ulong)local_428.deleter.m_deviceIface >> 0x20);
  data_01.deleter.m_device._0_4_ = (int)local_428.deleter.m_device;
  data_01.deleter.m_device._4_4_ = (int)((ulong)local_428.deleter.m_device >> 0x20);
  data_01.deleter.m_allocator._0_4_ = (int)local_428.deleter.m_allocator;
  data_01.deleter.m_allocator._4_4_ = (int)((ulong)local_428.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_408,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)23>_>::~Move(&local_448);
  makePipelineLayoutWithoutDescriptors
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator,
             vk_00,device_00);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_498,
             (Move *)&cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.
                      m_allocator);
  data_02.deleter.m_deviceIface._0_4_ = (int)local_498.deleter.m_deviceIface;
  data_02.object.m_internal = local_498.object.m_internal;
  data_02.deleter.m_deviceIface._4_4_ = (int)((ulong)local_498.deleter.m_deviceIface >> 0x20);
  data_02.deleter.m_device._0_4_ = (int)local_498.deleter.m_device;
  data_02.deleter.m_device._4_4_ = (int)((ulong)local_498.deleter.m_device >> 0x20);
  data_02.deleter.m_allocator._0_4_ = (int)local_498.deleter.m_allocator;
  data_02.deleter.m_allocator._4_4_ = (int)((ulong)local_498.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_478,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)16>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)16>_> *)
             &cmdPool.super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator);
  makeCommandPool((Move<vk::Handle<(vk::HandleType)24>_> *)
                  &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool,vk_00,
                  device_00,dVar5);
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_4f8,
             (Move *)&cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  data_03.deleter.m_deviceIface._0_4_ = (int)local_4f8.deleter.m_deviceIface;
  data_03.object.m_internal = local_4f8.object.m_internal;
  data_03.deleter.m_deviceIface._4_4_ = (int)((ulong)local_4f8.deleter.m_deviceIface >> 0x20);
  data_03.deleter.m_device._0_4_ = (int)local_4f8.deleter.m_device;
  data_03.deleter.m_device._4_4_ = (int)((ulong)local_4f8.deleter.m_device >> 0x20);
  data_03.deleter.m_allocator._0_4_ = (int)local_4f8.deleter.m_allocator;
  data_03.deleter.m_allocator._4_4_ = (int)((ulong)local_4f8.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4d8,data_03);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)24>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)24>_> *)
             &cmdBuffer.super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool);
  pHVar15 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)24>_> *)local_4d8);
  pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)pHVar15->m_internal;
  ::vk::allocateCommandBuffer
            (&local_578,vk_00,device_00,
             (VkCommandPool)
             pipeline.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_558,(Move *)&local_578);
  data_04.deleter.m_deviceIface._0_4_ = (int)local_558.deleter.m_deviceIface;
  data_04.object = local_558.object;
  data_04.deleter.m_deviceIface._4_4_ = (int)((ulong)local_558.deleter.m_deviceIface >> 0x20);
  data_04.deleter.m_device._0_4_ = (int)local_558.deleter.m_device;
  data_04.deleter.m_device._4_4_ = (int)((ulong)local_558.deleter.m_device >> 0x20);
  data_04.deleter.m_pool.m_internal._0_4_ = (int)local_558.deleter.m_pool.m_internal;
  data_04.deleter.m_pool.m_internal._4_4_ = (int)(local_558.deleter.m_pool.m_internal >> 0x20);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_538,data_04);
  ::vk::refdetails::Move<vk::VkCommandBuffer_s_*>::~Move(&local_578);
  GraphicsPipelineBuilder::GraphicsPipelineBuilder(&local_6e8);
  pGVar16 = GraphicsPipelineBuilder::setRenderSize
                      (&local_6e8,(IVec2 *)&colorImageAllLayersRange.layerCount);
  pPVar17 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"vert",&local_709);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_708);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_VERTEX_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_730,"frag",&local_731);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_730);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_FRAGMENT_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_758,"tesc",&local_759);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_758);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_780,"tese",&local_781);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_780);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pPVar17 = Context::getBinaryCollection((this->super_TestInstance).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7a8,"geom",&local_7a9);
  pPVar18 = ::vk::ProgramCollection<vk::ProgramBinary>::get(pPVar17,&local_7a8);
  pGVar16 = GraphicsPipelineBuilder::setShader
                      (pGVar16,vk_00,device_00,VK_SHADER_STAGE_GEOMETRY_BIT,pPVar18,
                       (VkSpecializationInfo *)0x0);
  pHVar19 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)16>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)16>_> *)local_478);
  pipelineLayout_00.m_internal = pHVar19->m_internal;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  colorAttachmentLayoutBarrier._64_8_ = pHVar13->m_internal;
  GraphicsPipelineBuilder::build
            (&local_5e0,pGVar16,vk_00,device_00,pipelineLayout_00,
             (VkRenderPass)colorAttachmentLayoutBarrier._64_8_);
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_5c0,(Move *)&local_5e0);
  data_05.deleter.m_deviceIface._0_4_ = (int)local_5c0.deleter.m_deviceIface;
  data_05.object.m_internal = local_5c0.object.m_internal;
  data_05.deleter.m_deviceIface._4_4_ = (int)((ulong)local_5c0.deleter.m_deviceIface >> 0x20);
  data_05.deleter.m_device._0_4_ = (int)local_5c0.deleter.m_device;
  data_05.deleter.m_device._4_4_ = (int)((ulong)local_5c0.deleter.m_device >> 0x20);
  data_05.deleter.m_allocator._0_4_ = (int)local_5c0.deleter.m_allocator;
  data_05.deleter.m_allocator._4_4_ = (int)((ulong)local_5c0.deleter.m_allocator >> 0x20);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5a0,data_05);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_5e0);
  std::__cxx11::string::~string((string *)&local_7a8);
  std::allocator<char>::~allocator(&local_7a9);
  std::__cxx11::string::~string((string *)&local_780);
  std::allocator<char>::~allocator(&local_781);
  std::__cxx11::string::~string((string *)&local_758);
  std::allocator<char>::~allocator(&local_759);
  std::__cxx11::string::~string((string *)&local_730);
  std::allocator<char>::~allocator(&local_731);
  std::__cxx11::string::~string((string *)&local_708);
  std::allocator<char>::~allocator(&local_709);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_6e8);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  beginCommandBuffer(vk_00,*ppVVar20);
  pVVar12 = tessellation::Image::operator*((Image *)local_280);
  subresourceRange_00.levelCount = colorImageAllLayersRange.aspectMask;
  subresourceRange_00.aspectMask = colorImageCreateInfo.initialLayout;
  subresourceRange_00.baseMipLevel = colorImageCreateInfo._84_4_;
  subresourceRange_00.baseArrayLayer = colorImageAllLayersRange.baseMipLevel;
  subresourceRange_00.layerCount = colorImageAllLayersRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_808,0,0x100,VK_IMAGE_LAYOUT_UNDEFINED,
             VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,(VkImage)pVVar12->m_internal,
             subresourceRange_00);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,1,0x80,0,0,0,0,0,1,local_808);
  clearColor.m_data._8_8_ = ::vk::makeOffset2D(0,0);
  dVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  dVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  ::vk::makeExtent2D(dVar5,dVar9);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)local_848,0.0,0.0,0.0,1.0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  commandBuffer = *ppVVar20;
  pHVar13 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)17>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  VVar2.m_internal = pHVar13->m_internal;
  pHVar21 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)23>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)23>_> *)local_408);
  beginRenderPass(vk_00,commandBuffer,VVar2,(VkFramebuffer)pHVar21->m_internal,
                  (VkRect2D *)(clearColor.m_data + 2),(Vec4 *)local_848);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  pVVar3 = *ppVVar20;
  pHVar22 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      ((RefBase<vk::Handle<(vk::HandleType)18>_> *)local_5a0);
  colorAttachmentPreCopyBarrier._64_8_ = pHVar22->m_internal;
  (*vk_00->_vptr_DeviceInterface[0x4c])(vk_00,pVVar3,0,colorAttachmentPreCopyBarrier._64_8_);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  (*vk_00->_vptr_DeviceInterface[0x59])(vk_00,*ppVVar20,1,1,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  endRenderPass(vk_00,*ppVVar20);
  pVVar12 = tessellation::Image::operator*((Image *)local_280);
  subresourceRange_01.levelCount = colorImageAllLayersRange.aspectMask;
  subresourceRange_01.aspectMask = colorImageCreateInfo.initialLayout;
  subresourceRange_01.baseMipLevel = colorImageCreateInfo._84_4_;
  subresourceRange_01.baseArrayLayer = colorImageAllLayersRange.baseMipLevel;
  subresourceRange_01.layerCount = colorImageAllLayersRange.levelCount;
  makeImageMemoryBarrier
            ((VkImageMemoryBarrier *)local_8a8,0x100,0x800,VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
             VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,(VkImage)pVVar12->m_internal,subresourceRange_01);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,0x400,0x1000,0,0,0,0,0,1,local_8a8);
  VVar24 = ::vk::makeImageSubresourceLayers(1,0,0,(this->m_params).numLayers);
  copyRegion.imageExtent._4_8_ = VVar24._0_8_;
  dVar5 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  dVar9 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  extent = ::vk::makeExtent3D(dVar5,dVar9,1);
  subresourceLayers_00.baseArrayLayer = (int)VVar24._8_8_;
  subresourceLayers_00.layerCount = (int)((ulong)VVar24._8_8_ >> 0x20);
  subresourceLayers_00.aspectMask = copyRegion.imageExtent.height;
  subresourceLayers_00.mipLevel = copyRegion.imageExtent.depth;
  makeBufferImageCopy((VkBufferImageCopy *)local_910,extent,subresourceLayers_00);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  pVVar3 = *ppVVar20;
  pVVar12 = tessellation::Image::operator*((Image *)local_280);
  dVar4 = pVVar12->m_internal;
  pVVar23 = tessellation::Buffer::operator*((Buffer *)local_2c8);
  postCopyBarrier.size = pVVar23->m_internal;
  (*vk_00->_vptr_DeviceInterface[99])(vk_00,pVVar3,dVar4,6,postCopyBarrier.size,1,(int)local_910);
  pVVar23 = tessellation::Buffer::operator*((Buffer *)local_2c8);
  makeBufferMemoryBarrier
            ((VkBufferMemoryBarrier *)local_9a0,0x1000,0x2000,(VkBuffer)pVVar23->m_internal,0,
             bufferSize);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  (*vk_00->_vptr_DeviceInterface[0x6d])(vk_00,*ppVVar20,0x1000,0x4000,0,0,0,1,(int)local_9a0,0,0);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  endCommandBuffer(vk_00,*ppVVar20);
  ppVVar20 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       ((RefBase<vk::VkCommandBuffer_s_*> *)local_538);
  submitCommandsAndWait(vk_00,device_00,queue_00,*ppVVar20);
  this_02 = tessellation::Buffer::getAllocation((Buffer *)local_2c8);
  imageAllLayers.m_data = (void *)::vk::Allocation::getMemory(this_02);
  offset = ::vk::Allocation::getOffset(this_02);
  ::vk::invalidateMappedMemoryRange
            (vk_00,device_00,(VkDeviceMemory)imageAllLayers.m_data,offset,bufferSize);
  _ndx = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
  iVar1 = (this->m_params).numLayers;
  data_06 = ::vk::Allocation::getHostPtr(this_02);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            ((ConstPixelBufferAccess *)local_9e0,(TextureFormat *)&ndx,iVar6,iVar7,iVar1,data_06);
  local_9e9 = true;
  for (local_9f0 = 0; local_9f0 < (this->m_params).numLayers; local_9f0 = local_9f0 + 1) {
    local_d75 = false;
    if (local_9e9 != false) {
      pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
      pTVar11 = tcu::TestContext::getLog(pTVar10);
      iVar1 = local_9f0;
      iVar6 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
      iVar7 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&colorImageAllLayersRange.layerCount);
      tcu::getSubregion(&local_a18,(ConstPixelBufferAccess *)local_9e0,0,0,iVar1,iVar6,iVar7,1);
      local_d75 = verifyResultLayer(pTVar11,&local_a18,local_9f0);
    }
    local_9e9 = local_d75;
  }
  local_a3a = 0;
  local_a3b = 0;
  if (local_9e9 == false) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,"Image comparison failed",&local_a61);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::allocator<char>::~allocator(&local_a61);
  }
  else {
    std::allocator<char>::allocator();
    local_a3a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"OK",&local_a39);
    local_a3b = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_a38);
  }
  if ((local_a3b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a38);
  }
  if ((local_a3a & 1) != 0) {
    std::allocator<char>::~allocator(&local_a39);
  }
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_5a0);
  ::vk::refdetails::Unique<vk::VkCommandBuffer_s_*>::~Unique
            ((Unique<vk::VkCommandBuffer_s_*> *)local_538);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)24>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)24>_> *)local_4d8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)16>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)16>_> *)local_478);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)23>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)23>_> *)local_408);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)17>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)17>_> *)local_3a8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)13>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)13>_> *)local_328);
  tessellation::Buffer::~Buffer((Buffer *)local_2c8);
  tessellation::Image::~Image((Image *)local_280);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus GridRenderTestInstance::iterate (void)
{
	requireFeatures(m_context.getInstanceInterface(), m_context.getPhysicalDevice(), FEATURE_TESSELLATION_SHADER | FEATURE_GEOMETRY_SHADER);

	m_context.getTestContext().getLog()
		<< tcu::TestLog::Message
		<< "Rendering single point at the origin. Expecting yellow and green colored grid-like image. (High-frequency grid may appear unicolored)."
		<< tcu::TestLog::EndMessage;

	const DeviceInterface&	vk					= m_context.getDeviceInterface();
	const VkDevice			device				= m_context.getDevice();
	const VkQueue			queue				= m_context.getUniversalQueue();
	const deUint32			queueFamilyIndex	= m_context.getUniversalQueueFamilyIndex();
	Allocator&				allocator			= m_context.getDefaultAllocator();

	// Color attachment

	const tcu::IVec2			  renderSize			   = tcu::IVec2(RENDER_SIZE, RENDER_SIZE);
	const VkFormat				  colorFormat			   = VK_FORMAT_R8G8B8A8_UNORM;
	const VkImageSubresourceRange colorImageAllLayersRange = makeImageSubresourceRange(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 1u, 0u, m_params.numLayers);
	const VkImageCreateInfo		  colorImageCreateInfo	   = makeImageCreateInfo(renderSize, colorFormat, VK_IMAGE_USAGE_COLOR_ATTACHMENT_BIT | VK_IMAGE_USAGE_TRANSFER_SRC_BIT, m_params.numLayers);
	const VkImageViewType		  colorAttachmentViewType  = (m_params.numLayers == 1 ? VK_IMAGE_VIEW_TYPE_2D : VK_IMAGE_VIEW_TYPE_2D_ARRAY);
	const Image					  colorAttachmentImage	   (vk, device, allocator, colorImageCreateInfo, MemoryRequirement::Any);

	// Color output buffer: image will be copied here for verification (big enough for all layers).

	const VkDeviceSize	colorBufferSizeBytes	= renderSize.x()*renderSize.y() * m_params.numLayers * tcu::getPixelSize(mapVkFormat(colorFormat));
	const Buffer		colorBuffer				(vk, device, allocator, makeBufferCreateInfo(colorBufferSizeBytes, VK_BUFFER_USAGE_TRANSFER_DST_BIT), MemoryRequirement::HostVisible);

	// Pipeline: no vertex input attributes nor descriptors.

	const Unique<VkImageView>		colorAttachmentView(makeImageView						(vk, device, *colorAttachmentImage, colorAttachmentViewType, colorFormat, colorImageAllLayersRange));
	const Unique<VkRenderPass>		renderPass		   (makeRenderPass						(vk, device, colorFormat));
	const Unique<VkFramebuffer>		framebuffer		   (makeFramebuffer						(vk, device, *renderPass, *colorAttachmentView, renderSize.x(), renderSize.y(), m_params.numLayers));
	const Unique<VkPipelineLayout>	pipelineLayout	   (makePipelineLayoutWithoutDescriptors(vk, device));
	const Unique<VkCommandPool>		cmdPool			   (makeCommandPool						(vk, device, queueFamilyIndex));
	const Unique<VkCommandBuffer>	cmdBuffer		   (allocateCommandBuffer				(vk, device, *cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY));

	const Unique<VkPipeline> pipeline (GraphicsPipelineBuilder()
		.setRenderSize	(renderSize)
		.setShader		(vk, device, VK_SHADER_STAGE_VERTEX_BIT,				  m_context.getBinaryCollection().get("vert"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_FRAGMENT_BIT,				  m_context.getBinaryCollection().get("frag"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_CONTROL_BIT,	  m_context.getBinaryCollection().get("tesc"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_TESSELLATION_EVALUATION_BIT, m_context.getBinaryCollection().get("tese"), DE_NULL)
		.setShader		(vk, device, VK_SHADER_STAGE_GEOMETRY_BIT,				  m_context.getBinaryCollection().get("geom"), DE_NULL)
		.build			(vk, device, *pipelineLayout, *renderPass));

	beginCommandBuffer(vk, *cmdBuffer);

	// Change color attachment image layout
	{
		const VkImageMemoryBarrier colorAttachmentLayoutBarrier = makeImageMemoryBarrier(
			(VkAccessFlags)0, VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT,
			VK_IMAGE_LAYOUT_UNDEFINED, VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TOP_OF_PIPE_BIT, VK_PIPELINE_STAGE_FRAGMENT_SHADER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentLayoutBarrier);
	}

	// Begin render pass
	{
		const VkRect2D renderArea = {
			makeOffset2D(0, 0),
			makeExtent2D(renderSize.x(), renderSize.y()),
		};
		const tcu::Vec4 clearColor(0.0f, 0.0f, 0.0f, 1.0f);

		beginRenderPass(vk, *cmdBuffer, *renderPass, *framebuffer, renderArea, clearColor);
	}

	vk.cmdBindPipeline(*cmdBuffer, VK_PIPELINE_BIND_POINT_GRAPHICS, *pipeline);

	vk.cmdDraw(*cmdBuffer, 1u, 1u, 0u, 0u);
	endRenderPass(vk, *cmdBuffer);

	// Copy render result to a host-visible buffer
	{
		const VkImageMemoryBarrier colorAttachmentPreCopyBarrier = makeImageMemoryBarrier(
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT, VK_ACCESS_TRANSFER_READ_BIT,
			VK_IMAGE_LAYOUT_COLOR_ATTACHMENT_OPTIMAL, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL,
			*colorAttachmentImage, colorImageAllLayersRange);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_COLOR_ATTACHMENT_OUTPUT_BIT, VK_PIPELINE_STAGE_TRANSFER_BIT, 0u,
			0u, DE_NULL, 0u, DE_NULL, 1u, &colorAttachmentPreCopyBarrier);
	}
	{
		const VkImageSubresourceLayers subresourceLayers = makeImageSubresourceLayers(VK_IMAGE_ASPECT_COLOR_BIT, 0u, 0u, m_params.numLayers);
		const VkBufferImageCopy		   copyRegion		 = makeBufferImageCopy(makeExtent3D(renderSize.x(), renderSize.y(), 1), subresourceLayers);
		vk.cmdCopyImageToBuffer(*cmdBuffer, *colorAttachmentImage, VK_IMAGE_LAYOUT_TRANSFER_SRC_OPTIMAL, *colorBuffer, 1u, &copyRegion);
	}
	{
		const VkBufferMemoryBarrier postCopyBarrier = makeBufferMemoryBarrier(
			VK_ACCESS_TRANSFER_WRITE_BIT, VK_ACCESS_HOST_READ_BIT, *colorBuffer, 0ull, colorBufferSizeBytes);

		vk.cmdPipelineBarrier(*cmdBuffer, VK_PIPELINE_STAGE_TRANSFER_BIT, VK_PIPELINE_STAGE_HOST_BIT, 0u,
			0u, DE_NULL, 1u, &postCopyBarrier, 0u, DE_NULL);
	}

	endCommandBuffer(vk, *cmdBuffer);
	submitCommandsAndWait(vk, device, queue, *cmdBuffer);

	// Verify results
	{
		const Allocation& alloc = colorBuffer.getAllocation();
		invalidateMappedMemoryRange(vk, device, alloc.getMemory(), alloc.getOffset(), colorBufferSizeBytes);

		const tcu::ConstPixelBufferAccess imageAllLayers(mapVkFormat(colorFormat), renderSize.x(), renderSize.y(), m_params.numLayers, alloc.getHostPtr());

		bool allOk = true;
		for (int ndx = 0; ndx < m_params.numLayers; ++ndx)
			allOk = allOk && verifyResultLayer(m_context.getTestContext().getLog(),
											   tcu::getSubregion(imageAllLayers, 0, 0, ndx, renderSize.x(), renderSize.y(), 1),
											   ndx);

		return (allOk ? tcu::TestStatus::pass("OK") : tcu::TestStatus::fail("Image comparison failed"));
	}
}